

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O0

global_object_create_result *
mjs::make_date_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  version vVar1;
  gc_heap *h_00;
  global_object *pgVar2;
  gc_heap_ptr<mjs::gc_string> *name;
  date_object *pdVar3;
  anon_class_16_1_570cf4e1_for_f local_2e0;
  gc_heap_ptr<mjs::object> local_2d0;
  anon_class_48_2_2a373439_for_f local_2c0;
  gc_heap_ptr<mjs::object> local_290;
  anon_class_1_0_00000001_for_f local_279;
  gc_heap_ptr<mjs::object> local_278;
  anon_class_32_1_89a21beb_for_f local_268;
  gc_heap_ptr<mjs::object> local_248;
  anon_class_32_1_89a21beb_for_f local_238;
  gc_heap_ptr<mjs::object> local_218;
  anon_class_32_1_89a21beb_for_f local_208;
  gc_heap_ptr<mjs::object> local_1e8;
  undefined1 local_1d0 [8];
  anon_class_16_2_4c7e7635 make_simple_date_mutator;
  anon_class_16_2_9fb1826f copy_func;
  anon_class_24_3_cfd939b3 make_date_mutator;
  gc_heap_ptr<mjs::date_object> **local_180;
  anon_class_24_3_cfd939b3 make_date_getter;
  anon_class_32_2_842af841 get_data_object;
  gc_heap_ptr<mjs::object> local_140;
  anon_class_8_1_54a39808_for_f local_130;
  gc_heap_ptr<mjs::object> local_128;
  gc_heap_ptr<mjs::object> local_118;
  value local_108;
  string local_e0;
  anon_class_16_1_39fd286b_for_f local_d0;
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  undefined1 local_90 [8];
  gc_heap_ptr<mjs::function_object> c;
  anon_class_16_1_f1e7abc2 new_date;
  gc_heap_ptr<mjs::object> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  undefined1 local_30 [8];
  gc_heap_ptr<mjs::date_object> prototype;
  gc_heap *h;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  h_00 = gc_heap_ptr_untyped::heap(&global->super_gc_heap_ptr_untyped);
  prototype.super_gc_heap_ptr_untyped._8_8_ = h_00;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"Date");
  string::string(&local_40,h_00,&local_50);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar2->super_object)._vptr_object[0xb])(&local_60);
  gc_heap::make<mjs::date_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,float>
            ((gc_heap *)local_30,(string *)h_00,(gc_heap_ptr<mjs::object> *)&local_40,
             (float *)&local_60);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_60);
  string::~string(&local_40);
  gc_heap_ptr<mjs::date_object>::gc_heap_ptr
            ((gc_heap_ptr<mjs::date_object> *)&c.super_gc_heap_ptr_untyped.pos_,
             (gc_heap_ptr<mjs::date_object> *)local_30);
  gc_heap_ptr<mjs::date_object>::gc_heap_ptr
            ((gc_heap_ptr<mjs::date_object> *)local_b0,(gc_heap_ptr<mjs::date_object> *)local_30);
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_26::__26
            ((__26 *)(local_b0 + 0x10),(anon_class_16_1_f1e7abc2 *)&c.super_gc_heap_ptr_untyped.pos_
            );
  gc_heap_ptr<mjs::date_object>::operator->((gc_heap_ptr<mjs::date_object> *)local_30);
  object::class_name((object *)local_c0);
  name = string::unsafe_raw_get((string *)local_c0);
  make_function<mjs::make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__25>
            ((mjs *)local_90,global,(anon_class_32_2_19efa78b_for_f *)local_b0,name,7);
  string::~string((string *)local_c0);
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_25::~__25((__25 *)local_b0);
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_26::__26
            ((__26 *)&local_d0,(anon_class_16_1_f1e7abc2 *)&c.super_gc_heap_ptr_untyped.pos_);
  make_constructable<mjs::make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__27>
            (global,(gc_heap_ptr<mjs::function_object> *)local_90,&local_d0);
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_27::~__27((__27 *)&local_d0);
  pdVar3 = gc_heap_ptr<mjs::date_object>::operator->((gc_heap_ptr<mjs::date_object> *)local_30);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar2->super_object)._vptr_object[0x13])(&local_e0,pgVar2,"constructor");
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&local_118,(gc_heap_ptr<mjs::function_object> *)local_90);
  value::value(&local_108,&local_118);
  (*(pdVar3->super_object)._vptr_object[1])(pdVar3,&local_e0,&local_108,2);
  value::~value(&local_108);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_118);
  string::~string(&local_e0);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&local_128,(gc_heap_ptr<mjs::function_object> *)local_90);
  local_130.h = (gc_heap *)prototype.super_gc_heap_ptr_untyped._8_8_;
  put_native_function<mjs::make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__28>
            (global,&local_128,"parse",&local_130,1);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_128);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&local_140,(gc_heap_ptr<mjs::function_object> *)local_90);
  put_native_function<mjs::make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__29>
            (global,&local_140,"UTC",
             (anon_class_1_0_00000001_for_f *)
             &get_data_object.prototype.super_gc_heap_ptr_untyped.field_0xf,7);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_140);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr
            ((gc_heap_ptr<mjs::global_object> *)&make_date_getter.prototype,global);
  gc_heap_ptr<mjs::date_object>::gc_heap_ptr
            ((gc_heap_ptr<mjs::date_object> *)&get_data_object.global.super_gc_heap_ptr_untyped.pos_
             ,(gc_heap_ptr<mjs::date_object> *)local_30);
  local_180 = &make_date_getter.prototype;
  make_date_getter.global = (gc_heap_ptr<mjs::global_object> *)local_30;
  make_date_getter.get_data_object = (anon_class_32_2_842af841 *)global;
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"valueOf");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getTime");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getYear");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getFullYear");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getUTCFullYear");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getMonth");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getUTCMonth");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getDate");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getUTCDate");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()(&local_180,"getDay")
  ;
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getUTCDay");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getHours");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getUTCHours");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getMinutes");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getUTCMinutes");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getSeconds");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getUTCSeconds");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getMilliseconds");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getUTCMilliseconds");
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::operator()
            (&local_180,"getTimezoneOffset");
  copy_func.h = (gc_heap *)&make_date_getter.prototype;
  make_simple_date_mutator.copy_func = (anon_class_16_2_9fb1826f *)local_30;
  copy_func.prototype = (gc_heap_ptr<mjs::date_object> *)prototype.super_gc_heap_ptr_untyped._8_8_;
  local_1d0 = (undefined1  [8])&copy_func.h;
  make_simple_date_mutator.make_date_mutator =
       (anon_class_24_3_cfd939b3 *)&make_simple_date_mutator.copy_func;
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_21::operator()
            (local_1d0,"setTime");
  make_date_object::anon_class_16_2_4c7e7635::operator()
            ((anon_class_16_2_4c7e7635 *)local_1d0,"setMilliseconds",0x30,0xffffffffffffffff,
             0xffffffffffffffff,0xffffffffffffffff);
  make_date_object::anon_class_16_2_4c7e7635::operator()
            ((anon_class_16_2_4c7e7635 *)local_1d0,"setSeconds",0x28,0x30,0xffffffffffffffff,
             0xffffffffffffffff);
  make_date_object::anon_class_16_2_4c7e7635::operator()
            ((anon_class_16_2_4c7e7635 *)local_1d0,"setMinutes",0x20,0x28,0x30,0xffffffffffffffff);
  make_date_object::anon_class_16_2_4c7e7635::operator()
            ((anon_class_16_2_4c7e7635 *)local_1d0,"setHours",0x18,0x20,0x28,0x30);
  make_date_object::anon_class_16_2_4c7e7635::operator()
            ((anon_class_16_2_4c7e7635 *)local_1d0,"setDate",0x10,0xffffffffffffffff,
             0xffffffffffffffff,0xffffffffffffffff);
  make_date_object::anon_class_16_2_4c7e7635::operator()
            ((anon_class_16_2_4c7e7635 *)local_1d0,"setMonth",8,0x10,0xffffffffffffffff,
             0xffffffffffffffff);
  make_date_object::anon_class_16_2_4c7e7635::operator()
            ((anon_class_16_2_4c7e7635 *)local_1d0,"setFullYear",0,8,0x10,0xffffffffffffffff);
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_21::operator()
            (&copy_func.h,"setYear");
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::date_object,void>
            (&local_1e8,(gc_heap_ptr<mjs::date_object> *)local_30);
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_31::__31
            ((__31 *)&local_208,(anon_class_32_2_842af841 *)&make_date_getter.prototype);
  put_native_function<mjs::make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__30>
            (global,&local_1e8,"toString",&local_208,0);
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_30::~__30((__30 *)&local_208);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_1e8);
  make_date_object::anon_class_16_2_9fb1826f::operator()
            ((anon_class_16_2_9fb1826f *)&make_simple_date_mutator.copy_func,L"toString",
             L"toLocaleString");
  make_date_object::anon_class_16_2_9fb1826f::operator()
            ((anon_class_16_2_9fb1826f *)&make_simple_date_mutator.copy_func,L"toString",
             L"toUTCString");
  make_date_object::anon_class_16_2_9fb1826f::operator()
            ((anon_class_16_2_9fb1826f *)&make_simple_date_mutator.copy_func,L"toString",
             L"toGMTString");
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  vVar1 = global_object::language_version(pgVar2);
  if (0 < (int)vVar1) {
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::date_object,void>
              (&local_218,(gc_heap_ptr<mjs::date_object> *)local_30);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_31::__31
              ((__31 *)&local_238,(anon_class_32_2_842af841 *)&make_date_getter.prototype);
    put_native_function<mjs::make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__33>
              (global,&local_218,"toTimeString",&local_238,0);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_33::~__33((__33 *)&local_238);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_218);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::date_object,void>
              (&local_248,(gc_heap_ptr<mjs::date_object> *)local_30);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_31::__31
              ((__31 *)&local_268,(anon_class_32_2_842af841 *)&make_date_getter.prototype);
    put_native_function<mjs::make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__34>
              (global,&local_248,"toDateString",&local_268,0);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_34::~__34((__34 *)&local_268);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_248);
    make_date_object::anon_class_16_2_9fb1826f::operator()
              ((anon_class_16_2_9fb1826f *)&make_simple_date_mutator.copy_func,L"toTimeString",
               L"toLocaleTimeString");
    make_date_object::anon_class_16_2_9fb1826f::operator()
              ((anon_class_16_2_9fb1826f *)&make_simple_date_mutator.copy_func,L"toDateString",
               L"toLocaleDateString");
  }
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  vVar1 = global_object::language_version(pgVar2);
  if (1 < (int)vVar1) {
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_278,(gc_heap_ptr<mjs::function_object> *)local_90);
    put_native_function<mjs::make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__35>
              (global,&local_278,"now",&local_279,0);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_278);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::date_object,void>
              (&local_290,(gc_heap_ptr<mjs::date_object> *)local_30);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_31::__31
              ((__31 *)&local_2c0,(anon_class_32_2_842af841 *)&make_date_getter.prototype);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2c0.global,global);
    put_native_function<mjs::make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__36>
              (global,&local_290,"toISOString",&local_2c0,0);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_36::~__36((__36 *)&local_2c0);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_290);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::date_object,void>
              (&local_2d0,(gc_heap_ptr<mjs::date_object> *)local_30);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2e0.global,global);
    put_native_function<mjs::make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__37>
              (global,&local_2d0,"toJSON",&local_2e0,1);
    make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_37::~__37((__37 *)&local_2e0);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_2d0);
  }
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::function_object> *)local_90);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::date_object,void>
            (&__return_storage_ptr__->prototype,(gc_heap_ptr<mjs::date_object> *)local_30);
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_31::~__31
            ((__31 *)&make_date_getter.prototype);
  gc_heap_ptr<mjs::function_object>::~gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)local_90);
  make_date_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_26::~__26
            ((__26 *)&c.super_gc_heap_ptr_untyped.pos_);
  gc_heap_ptr<mjs::date_object>::~gc_heap_ptr((gc_heap_ptr<mjs::date_object> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_date_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();

    auto prototype = h.make<date_object>(string{h, "Date"}, global->object_prototype(), NAN);

    auto new_date = [prototype](double val) {
        return prototype.heap().make<date_object>(prototype->class_name(), prototype, val);
    };

    auto c = make_function(global, [prototype, new_date](const value&, const std::vector<value>&) {
        // Equivalent to (new Date()).toString()
        return value{to_string(prototype.heap(), value{new_date(date_helper::current_time_utc())})};
    }, prototype->class_name().unsafe_raw_get(), 7);
    make_constructable(global, c, [new_date](const value&, const std::vector<value>& args) {
        if (args.empty()) {
            return value{new_date(date_helper::current_time_utc())};
        } else if (args.size() == 1) {
            auto v = to_primitive(args[0]);
            if (v.type() == value_type::string) {
                // return Date.parse(v)
                return value{new_date(date_helper::parse(v.string_value().view()))};
            }
            return value{new_date(to_number(v))};
        } else if (args.size() == 2) {
            NOT_IMPLEMENTED("new Date(value)");
        }
        return value{date_helper::time_clip(date_helper::utc(date_helper::time_from_args(args)))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    put_native_function(global, c, "parse", [&h](const value&, const std::vector<value>& args) {
        if (!args.empty()) {
            const auto s = to_string(h, args.front());
            return value{date_helper::parse(s.view())};
        }
        return value{NAN};
    }, 1);
    put_native_function(global, c, "UTC", [](const value&, const std::vector<value>& args) {
        if (args.size() < 3) {
            NOT_IMPLEMENTED("Date.UTC() with less than 3 arguments");
        }
        return value{date_helper::time_clip(date_helper::time_from_args(args))};
    }, 7);

    auto get_data_object = [global, prototype](const value& this_) {
        global->validate_type(this_, prototype, "Date");
        return gc_heap_ptr<date_object>{this_.object_value()};
    };

    auto make_date_getter = [&](const char* name, auto f) {
        put_native_function(global, prototype, name ,[f, get_data_object](const value& this_, const std::vector<value>&) {
            const double t = get_data_object(this_)->date_value();
            if (std::isnan(t)) {
                return value{t};
            }
            return value{static_cast<double>(f(t))};
        }, 0);
    };
    make_date_getter("valueOf", [](double t) { return t; });
    make_date_getter("getTime", [](double t) { return t; });
    make_date_getter("getYear", [](double t) {
        return date_helper::year_from_time(date_helper::local_time(t)) - 1900;
    });
    make_date_getter("getFullYear", [](double t) {
        return date_helper::year_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCFullYear", [](double t) {
        return date_helper::year_from_time(t);
    });
    make_date_getter("getMonth", [](double t) {
        return date_helper::month_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCMonth", [](double t) {
        return date_helper::month_from_time(t);
    });
    make_date_getter("getDate", [](double t) {
        return date_helper::date_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCDate", [](double t) {
        return date_helper::date_from_time(t);
    });
    make_date_getter("getDay", [](double t) {
        return date_helper::week_day(date_helper::local_time(t));
    });
    make_date_getter("getUTCDay", [](double t) {
        return date_helper::week_day(t);
    });
    make_date_getter("getHours", [](double t) {
        return date_helper::hour_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCHours", [](double t) {
        return date_helper::hour_from_time(t);
    });
    make_date_getter("getMinutes", [](double t) {
        return date_helper::min_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCMinutes", [](double t) {
        return date_helper::min_from_time(t);
    });
    make_date_getter("getSeconds", [](double t) {
        return date_helper::sec_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCSeconds", [](double t) {
        return date_helper::sec_from_time(t);
    });
    make_date_getter("getMilliseconds", [](double t) {
        return date_helper::ms_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCMilliseconds", [](double t) {
        return date_helper::ms_from_time(t);
    });
    make_date_getter("getTimezoneOffset", [](double t) {
        return (t - date_helper::local_time(t)) / date_helper::ms_per_minute;
    });

    auto make_date_mutator = [&](const char* name, auto f) {
        put_native_function(global, prototype, name, [f, get_data_object](const value& this_, const std::vector<value>& args) {
            auto d = get_data_object(this_);
            const auto v = f(d->date_value(), !args.empty() ? to_number(args[0]) : NAN, args);
            d->date_value(v);
            return value{v};
        }, 0);
    };

    auto copy_func = [&](const wchar_t* from, const wchar_t* to) {
        prototype->put(string{h, to}, prototype->get(from), prototype->own_property_attributes(from));
    };

    using field_ptr = double date_time::*;

    auto make_simple_date_mutator = [&](const char* name, field_ptr field0, field_ptr field1 = nullptr, field_ptr field2 = nullptr, field_ptr field3 = nullptr) {
        make_date_mutator(name, [field0, field1, field2, field3](double current, double arg, const std::vector<value>& args) {
            auto dt = date_helper::date_time_from_time(current);
            dt.*field0 = arg;
            if (field1 && args.size() > 1) dt.*field1 = to_number(args[1]);
            if (field2 && args.size() > 2) dt.*field2 = to_number(args[2]);
            if (field3 && args.size() > 3) dt.*field3 = to_number(args[3]);
            return date_helper::time_from_date_time(dt);
        });
        const std::wstring from{name, name+std::strlen(name)};
        assert(from.compare(0, 3, L"set") == 0);
        copy_func(from.c_str(), (L"setUTC" + from.substr(3)).c_str());
    };

    make_date_mutator("setTime", [](double, double arg, const std::vector<value>&) {
        return arg;
    });

    make_simple_date_mutator("setMilliseconds", &date_time::ms);
    make_simple_date_mutator("setSeconds", &date_time::s, &date_time::ms);
    make_simple_date_mutator("setMinutes", &date_time::m, &date_time::s, &date_time::ms);
    make_simple_date_mutator("setHours", &date_time::h, &date_time::m, &date_time::s, &date_time::ms);
    make_simple_date_mutator("setDate", &date_time::day);
    make_simple_date_mutator("setMonth", &date_time::month, &date_time::day);
    make_simple_date_mutator("setFullYear", &date_time::year, &date_time::month, &date_time::day);

    make_date_mutator("setYear", [](double current, double arg, const std::vector<value>&) {
        auto dt = date_helper::date_time_from_time(current);
        dt.year = arg + 1900;
        return date_helper::time_from_date_time(dt);
    });

    put_native_function(global, prototype, "toString", [get_data_object](const value& this_, const std::vector<value>&) {
        auto o = get_data_object(this_);
        return value{date_helper::to_string(o.heap(), o->date_value())};
    }, 0);

    copy_func(L"toString", L"toLocaleString");
    copy_func(L"toString", L"toUTCString");
    copy_func(L"toString", L"toGMTString");

    if (global->language_version() >= version::es3) {
        put_native_function(global, prototype, "toTimeString", [get_data_object](const value& this_, const std::vector<value>&) {
            auto o = get_data_object(this_);
            return value{date_helper::to_time_string(o.heap(), o->date_value())};
        }, 0);

        put_native_function(global, prototype, "toDateString", [get_data_object](const value& this_, const std::vector<value>&) {
            auto o = get_data_object(this_);
            return value{date_helper::to_date_string(o.heap(), o->date_value())};
        }, 0);

        copy_func(L"toTimeString", L"toLocaleTimeString");
        copy_func(L"toDateString", L"toLocaleDateString");
    }

    if (global->language_version() >= version::es5) {
        put_native_function(global, c, "now", [](const value&, const std::vector<value>&) {
            return value{date_helper::current_time_utc()};
        }, 0);

        put_native_function(global, prototype, "toISOString", [get_data_object, global](const value& this_, const std::vector<value>&) {
            auto o = get_data_object(this_);
            return value{date_helper::to_iso_string(global, o->date_value())};
        }, 0);

        put_native_function(global, prototype, "toJSON", [global](const value& this_, const std::vector<value>&) {
            return date_helper::to_json(global, this_);
        }, 1);
    }

    return { c, prototype };
}